

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

var __thiscall
cs::method_import_as::get_namespace(method_import_as *this,context_t *context,iterator it)

{
  token_base *ptVar1;
  proxy *ppVar2;
  bool bVar3;
  int iVar4;
  token_base **pptVar5;
  type_info *this_00;
  shared_ptr<cs::name_space> *psVar6;
  var *pvVar7;
  compile_error *pcVar8;
  allocator local_51;
  undefined1 local_50 [8];
  undefined1 local_48 [32];
  iterator it_local;
  
  pptVar5 = tree_type<cs::token_base_*>::iterator::data(&it_local);
  ptVar1 = *pptVar5;
  if (ptVar1 == (token_base *)0x0) {
    (this->super_method_base)._vptr_method_base = (_func_int **)0x0;
  }
  else {
    iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1);
    if (iVar4 != 4) {
      iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1);
      if ((iVar4 != 3) || (*(int *)&ptVar1[1]._vptr_token_base != 0xe)) {
        pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)local_48,
                   "Wrong grammar for import-as statement, expect <package name> or <package name>.<namespace id>..."
                   ,(allocator *)local_50);
        compile_error::compile_error(pcVar8,(string *)local_48);
        __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
      }
      tree_type<cs::token_base_*>::iterator::left(&it_local);
      get_namespace((method_import_as *)local_50,context,it);
      local_48._0_8_ = tree_type<cs::token_base_*>::iterator::right(&it_local);
      pptVar5 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_48);
      ptVar1 = *pptVar5;
      if ((ptVar1 != (token_base *)0x0) &&
         (iVar4 = (*ptVar1->_vptr_token_base[2])(ptVar1), iVar4 == 4)) {
        if (local_50 == (undefined1  [8])0x0) {
          this_00 = (type_info *)&void::typeinfo;
        }
        else {
          this_00 = (type_info *)
                    (**(code **)(*(long *)*(_func_int **)((long)local_50 + 0x10) + 0x10))();
        }
        bVar3 = std::type_info::operator==
                          (this_00,(type_info *)&std::shared_ptr<cs::name_space>::typeinfo);
        if (bVar3) {
          psVar6 = cs_impl::any::const_val<std::shared_ptr<cs::name_space>>((any *)local_50);
          pvVar7 = name_space::get_var((psVar6->
                                       super___shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr,(var_id *)(ptVar1 + 1));
          ppVar2 = pvVar7->mDat;
          if (ppVar2 != (proxy *)0x0) {
            ppVar2->refcount = ppVar2->refcount + 1;
          }
          (this->super_method_base)._vptr_method_base = (_func_int **)ppVar2;
          cs_impl::any::recycle((any *)local_50);
          return (var)(proxy *)this;
        }
        pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)local_48,"Access non-namespace object.",&local_51);
        compile_error::compile_error(pcVar8,(string *)local_48);
        __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
      }
      pcVar8 = (compile_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)local_48,
                 "Wrong grammar for import-as statement, expect <package name> or <package name>.<namespace id>..."
                 ,&local_51);
      compile_error::compile_error(pcVar8,(string *)local_48);
      __cxa_throw(pcVar8,&compile_error::typeinfo,compile_error::~compile_error);
    }
    instance_type::import
              ((instance_type *)local_48,(string *)(it.mData)->root->right,
               (string *)(current_process + 0x58));
    make_namespace((cs *)this,(namespace_t *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  }
  return (var)(proxy *)this;
}

Assistant:

var method_import_as::get_namespace(const context_t &context, tree_type<token_base *>::iterator it)
	{
		token_base *token = it.data();
		if (token == nullptr)
			return var();
		if (token->get_type() == token_types::id) {
			const var_id &package_name = static_cast<token_id *>(token)->get_id();
			return make_namespace(context->instance->import(current_process->import_path, package_name));
		}
		else if (token->get_type() == token_types::signal &&
		         static_cast<token_signal *>(token)->get_signal() == signal_types::dot_) {
			const var &ext = get_namespace(context, it.left());
			token_base *id = it.right().data();
			if (id == nullptr || id->get_type() != token_types::id)
				throw compile_error(
				    "Wrong grammar for import-as statement, expect <package name> or <package name>.<namespace id>...");
			if (ext.type() == typeid(namespace_t))
				return ext.const_val<namespace_t>()->get_var(static_cast<token_id *>(id)->get_id());
			else
				throw compile_error("Access non-namespace object.");
		}
		else
			throw compile_error(
			    "Wrong grammar for import-as statement, expect <package name> or <package name>.<namespace id>...");
	}